

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  PolicyStatus PVar7;
  int iVar8;
  char *pcVar9;
  undefined7 extraout_var;
  ostream *poVar10;
  PolicyID id;
  cmCommand *pcVar11;
  string *psVar12;
  long lVar13;
  ulong uVar14;
  _Alloc_hider name;
  allocator local_385;
  uint local_384;
  cmCommand *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string vv;
  string vs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  uint v [4];
  string extraInclude;
  char local_298 [64];
  char local_258 [64];
  char local_218 [184];
  string version;
  string srcdir;
  string bindir;
  RegularExpression vx;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
    std::__cxx11::string::string
              ((string *)&extraInclude,"PROJECT called with incorrect number of arguments",
               (allocator *)&vx);
    cmCommand::SetError(&this->super_cmCommand,&extraInclude);
    std::__cxx11::string::~string((string *)&extraInclude);
    return false;
  }
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,(pbVar1->_M_dataplus)._M_p);
  std::__cxx11::string::string
            ((string *)&bindir,
             (string *)
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::append((char *)&bindir);
  std::__cxx11::string::string
            ((string *)&srcdir,
             (string *)
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::append((char *)&srcdir);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
  cmMakefile::AddCacheDefinition(pcVar2,&bindir,pcVar9,"Value Computed by CMake",STATIC,false);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
  cmMakefile::AddCacheDefinition(pcVar2,&srcdir,pcVar9,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::assign((char *)&bindir);
  std::__cxx11::string::assign((char *)&srcdir);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&bindir,pcVar9);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&srcdir,pcVar9);
  pcVar2 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&extraInclude,"PROJECT_NAME",(allocator *)&vx);
  cmMakefile::AddDefinition
            (pcVar2,&extraInclude,
             (((args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&extraInclude);
  pcVar2 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&extraInclude,"CMAKE_PROJECT_NAME",(allocator *)&vx);
  pcVar9 = cmMakefile::GetDefinition(pcVar2,&extraInclude);
  if (pcVar9 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&extraInclude);
LAB_00325ea4:
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&extraInclude,"CMAKE_PROJECT_NAME",(allocator *)&vx);
    cmMakefile::AddDefinition
              (pcVar2,&extraInclude,
               (((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&extraInclude);
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&extraInclude,"CMAKE_PROJECT_NAME",(allocator *)&vx);
    cmMakefile::AddCacheDefinition
              (pcVar2,&extraInclude,
               (((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
               "Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)&extraInclude);
  }
  else {
    bVar3 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    std::__cxx11::string::~string((string *)&extraInclude);
    if (bVar3) goto LAB_00325ea4;
  }
  version._M_dataplus._M_p = (pointer)&version.field_2;
  version._M_string_length = 0;
  version.field_2._M_local_buf[0] = '\0';
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = false;
  lVar13 = 0x20;
  local_384 = 0;
  bVar6 = false;
  uVar14 = 1;
  local_380 = &this->super_cmCommand;
  for (; pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      uVar14 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar14 = uVar14 + 1) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar13),"LANGUAGES");
    if (bVar4) {
      if ((local_384 & 1) != 0) {
        pcVar2 = local_380->Makefile;
        std::__cxx11::string::string
                  ((string *)&extraInclude,"LANGUAGES may be specified at most once.",
                   (allocator *)&vx);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&extraInclude);
        goto LAB_00326549;
      }
      local_384 = (uint)CONCAT71(extraout_var,1);
LAB_0032601a:
      bVar3 = false;
      bVar4 = bVar6;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar13),"VERSION");
      if (!bVar4) {
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)&version);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&languages,
                      (value_type *)
                      ((long)&(((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar13));
        }
        goto LAB_0032601a;
      }
      bVar3 = true;
      bVar4 = true;
      if (bVar6) {
        pcVar2 = local_380->Makefile;
        std::__cxx11::string::string
                  ((string *)&extraInclude,"VERSION may be specified at most once.",(allocator *)&vx
                  );
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&extraInclude);
        goto LAB_00326549;
      }
    }
    bVar6 = bVar4;
    lVar13 = lVar13 + 0x20;
  }
  if (bVar6) {
    if ((local_384 & 1) != 0) {
LAB_0032609b:
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string((string *)&extraInclude,"NONE",(allocator *)&vx);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                   &extraInclude);
        std::__cxx11::string::~string((string *)&extraInclude);
      }
      goto LAB_003260eb;
    }
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003260eb;
    pcVar2 = local_380->Makefile;
    std::__cxx11::string::string
              ((string *)&extraInclude,
               "project with VERSION must use LANGUAGES before language names.",(allocator *)&vx);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&extraInclude);
LAB_00326549:
    std::__cxx11::string::~string((string *)&extraInclude);
    cmSystemTools::s_FatalErrorOccured = true;
    bVar3 = true;
  }
  else {
    if ((local_384 & 1) != 0) goto LAB_0032609b;
LAB_003260eb:
    PVar7 = cmMakefile::GetPolicyStatus(local_380->Makefile,CMP0048);
    pcVar11 = local_380;
    if (bVar6) {
      if (PVar7 < NEW) {
        pcVar2 = local_380->Makefile;
        std::__cxx11::string::string
                  ((string *)&extraInclude,"VERSION not allowed unless CMP0048 is set to NEW",
                   (allocator *)&vx);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&extraInclude);
        goto LAB_00326549;
      }
      cmsys::RegularExpression::RegularExpression
                (&vx,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      cVar5 = cmsys::RegularExpression::find(&vx,version._M_dataplus._M_p);
      if ((bool)cVar5) {
        local_384 = CONCAT31(local_384._1_3_,cVar5);
        vs._M_dataplus._M_p = (pointer)&vs.field_2;
        vs._M_string_length = 0;
        vs.field_2._M_local_buf[0] = '\0';
        v[0] = 0;
        v[1] = 0;
        v[2] = 0;
        v[3] = 0;
        iVar8 = __isoc99_sscanf(version._M_dataplus._M_p,"%u.%u.%u.%u",v,v + 1,v + 2,v + 3);
        psVar12 = &extraInclude;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          if (lVar13 < iVar8) {
            sprintf((char *)psVar12,"%u",(ulong)v[lVar13]);
            std::__cxx11::string::append((char *)&vs);
            std::__cxx11::string::append((char *)&vs);
          }
          else {
            *(undefined1 *)&(psVar12->_M_dataplus)._M_p = 0;
          }
          psVar12 = psVar12 + 2;
        }
        vv._M_dataplus._M_p = (pointer)&vv.field_2;
        vv._M_string_length = 0;
        vv.field_2._M_allocated_capacity = vv.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::operator+(&local_378,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,"_VERSION");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        pcVar11 = local_380;
        pcVar2 = local_380->Makefile;
        std::__cxx11::string::string((string *)&local_378,"PROJECT_VERSION",&local_385);
        cVar5 = (char)local_384;
        cmMakefile::AddDefinition(pcVar2,&local_378,vs._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_378);
        cmMakefile::AddDefinition(pcVar11->Makefile,&vv,vs._M_dataplus._M_p);
        std::operator+(&local_378,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        pcVar2 = pcVar11->Makefile;
        std::__cxx11::string::string((string *)&local_378,"PROJECT_VERSION_MAJOR",&local_385);
        cmMakefile::AddDefinition(pcVar2,&local_378,(char *)&extraInclude);
        std::__cxx11::string::~string((string *)&local_378);
        cmMakefile::AddDefinition(pcVar11->Makefile,&vv,(char *)&extraInclude);
        std::operator+(&local_378,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        pcVar2 = pcVar11->Makefile;
        std::__cxx11::string::string((string *)&local_378,"PROJECT_VERSION_MINOR",&local_385);
        cmMakefile::AddDefinition(pcVar2,&local_378,local_298);
        std::__cxx11::string::~string((string *)&local_378);
        cmMakefile::AddDefinition(pcVar11->Makefile,&vv,local_298);
        std::operator+(&local_378,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        pcVar2 = pcVar11->Makefile;
        std::__cxx11::string::string((string *)&local_378,"PROJECT_VERSION_PATCH",&local_385);
        cmMakefile::AddDefinition(pcVar2,&local_378,local_258);
        std::__cxx11::string::~string((string *)&local_378);
        cmMakefile::AddDefinition(pcVar11->Makefile,&vv,local_258);
        std::operator+(&local_378,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        pcVar2 = pcVar11->Makefile;
        std::__cxx11::string::string((string *)&local_378,"PROJECT_VERSION_TWEAK",&local_385);
        cmMakefile::AddDefinition(pcVar2,&local_378,local_218);
        std::__cxx11::string::~string((string *)&local_378);
        cmMakefile::AddDefinition(pcVar11->Makefile,&vv,local_218);
        std::__cxx11::string::~string((string *)&vv);
        psVar12 = &vs;
      }
      else {
        std::operator+(&vs,"VERSION \"",&version);
        std::operator+(&extraInclude,&vs,"\" format invalid.");
        std::__cxx11::string::~string((string *)&vs);
        cmMakefile::IssueMessage(pcVar11->Makefile,FATAL_ERROR,&extraInclude);
        cmSystemTools::s_FatalErrorOccured = true;
        psVar12 = &extraInclude;
      }
      std::__cxx11::string::~string((string *)psVar12);
      cmsys::RegularExpression::~RegularExpression(&vx);
      bVar3 = true;
      if (cVar5 == '\0') goto LAB_00326aed;
    }
    else if (PVar7 != OLD) {
      vv._M_dataplus._M_p = (pointer)0x0;
      vv._M_string_length = 0;
      vv.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&extraInclude,"PROJECT_VERSION",(allocator *)&vx);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::__cxx11::string::string((string *)&extraInclude,"PROJECT_VERSION_MAJOR",(allocator *)&vx)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::__cxx11::string::string((string *)&extraInclude,"PROJECT_VERSION_MINOR",(allocator *)&vx)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::__cxx11::string::string((string *)&extraInclude,"PROJECT_VERSION_PATCH",(allocator *)&vx)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::__cxx11::string::string((string *)&extraInclude,"PROJECT_VERSION_TWEAK",(allocator *)&vx)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,"_VERSION");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,"_VERSION_MAJOR");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,"_VERSION_MINOR");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,"_VERSION_PATCH");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::operator+(&extraInclude,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,"_VERSION_TWEAK");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      vx.startp[0] = (char *)(vx.startp + 2);
      vx.startp[1] = (char *)0x0;
      vx.startp[2]._0_1_ = 0;
      for (name = vv._M_dataplus; name._M_p != (pointer)vv._M_string_length;
          name._M_p = name._M_p + 0x20) {
        pcVar9 = cmMakefile::GetDefinition(pcVar11->Makefile,(string *)name._M_p);
        if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
          if (PVar7 == WARN) {
            std::__cxx11::string::append((char *)&vx);
            std::__cxx11::string::append((string *)&vx);
          }
          else {
            cmMakefile::AddDefinition(pcVar11->Makefile,(string *)name._M_p,"");
          }
        }
      }
      if (vx.startp[1] != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&extraInclude);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&vs,(cmPolicies *)0x30,id);
        poVar10 = std::operator<<((ostream *)&extraInclude,(string *)&vs);
        poVar10 = std::operator<<(poVar10,"\nThe following variable(s) would be set to empty:");
        std::operator<<(poVar10,(string *)&vx);
        std::__cxx11::string::~string((string *)&vs);
        pcVar2 = pcVar11->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&vs);
        std::__cxx11::string::~string((string *)&vs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extraInclude);
      }
      std::__cxx11::string::~string((string *)&vx);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vv);
    }
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&extraInclude,"C",(allocator *)&vx);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
      std::__cxx11::string::string((string *)&extraInclude,"CXX",(allocator *)&vx);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                 &extraInclude);
      std::__cxx11::string::~string((string *)&extraInclude);
    }
    cmMakefile::EnableLanguage(pcVar11->Makefile,&languages,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                   "CMAKE_PROJECT_",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&extraInclude,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                   "_INCLUDE");
    pcVar11 = local_380;
    std::__cxx11::string::~string((string *)&vx);
    pcVar9 = cmMakefile::GetDefinition(pcVar11->Makefile,&extraInclude);
    bVar3 = true;
    if (((pcVar9 != (char *)0x0) &&
        (bVar6 = cmMakefile::ReadDependentFile(pcVar11->Makefile,pcVar9,true), !bVar6)) &&
       (bVar6 = cmSystemTools::GetFatalErrorOccured(), !bVar6)) {
      std::__cxx11::string::string((string *)&vx,"could not find file:\n  ",(allocator *)&vs);
      std::__cxx11::string::append((char *)&vx);
      cmCommand::SetError(pcVar11,(string *)&vx);
      std::__cxx11::string::~string((string *)&vx);
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&extraInclude);
  }
LAB_00326aed:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&languages);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::string::~string((string *)&srcdir);
  std::__cxx11::string::~string((string *)&bindir);
  return bVar3;
}

Assistant:

bool cmProjectCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
    }
  this->Makefile->SetProjectName(args[0].c_str());

  std::string bindir = args[0];
  bindir += "_BINARY_DIR";
  std::string srcdir = args[0];
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition
    (bindir,
     this->Makefile->GetCurrentBinaryDirectory(),
     "Value Computed by CMake", cmState::STATIC);
  this->Makefile->AddCacheDefinition
    (srcdir,
     this->Makefile->GetCurrentSourceDirectory(),
     "Value Computed by CMake", cmState::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(bindir,
          this->Makefile->GetCurrentBinaryDirectory());
  this->Makefile->AddDefinition(srcdir,
          this->Makefile->GetCurrentSourceDirectory());

  this->Makefile->AddDefinition("PROJECT_NAME", args[0].c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if(!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME")
     || (this->Makefile->IsRootMakefile()))
    {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", args[0].c_str());
    this->Makefile->AddCacheDefinition
      ("CMAKE_PROJECT_NAME",
       args[0].c_str(),
       "Value Computed by CMake", cmState::STATIC);
    }

  bool haveVersion = false;
  bool haveLanguages = false;
  std::string version;
  std::vector<std::string> languages;
  enum Doing { DoingLanguages, DoingVersion };
  Doing doing = DoingLanguages;
  for(size_t i = 1; i < args.size(); ++i)
    {
    if(args[i] == "LANGUAGES")
      {
      if(haveLanguages)
        {
        this->Makefile->IssueMessage
          (cmake::FATAL_ERROR, "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
        }
      haveLanguages = true;
      doing = DoingLanguages;
      }
    else if (args[i] == "VERSION")
      {
      if(haveVersion)
        {
        this->Makefile->IssueMessage
          (cmake::FATAL_ERROR, "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
        }
      haveVersion = true;
      doing = DoingVersion;
      }
    else if(doing == DoingVersion)
      {
      doing = DoingLanguages;
      version = args[i];
      }
    else // doing == DoingLanguages
      {
      languages.push_back(args[i]);
      }
    }

  if (haveVersion && !haveLanguages && !languages.empty())
    {
    this->Makefile->IssueMessage
      (cmake::FATAL_ERROR,
       "project with VERSION must use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }
  if (haveLanguages && languages.empty())
    {
    languages.push_back("NONE");
    }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion)
    {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD ||
        cmp0048 == cmPolicies::WARN)
      {
      this->Makefile->IssueMessage
        (cmake::FATAL_ERROR,
         "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
      }

    cmsys::RegularExpression
      vx("^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    if(!vx.find(version))
      {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
      }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = {0,0,0,0};
    int vc = sscanf(version.c_str(), "%u.%u.%u.%u",
                    &v[0], &v[1], &v[2], &v[3]);
    for(int i=0; i < 4; ++i)
      {
      if(i < vc)
        {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
        }
      else
        {
        vb[i][0] = 0;
        }
      }

    std::string vv;
    vv = args[0] + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = args[0] + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = args[0] + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = args[0] + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = args[0] + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    }
  else if(cmp0048 != cmPolicies::OLD)
    {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.push_back("PROJECT_VERSION");
    vv.push_back("PROJECT_VERSION_MAJOR");
    vv.push_back("PROJECT_VERSION_MINOR");
    vv.push_back("PROJECT_VERSION_PATCH");
    vv.push_back("PROJECT_VERSION_TWEAK");
    vv.push_back(args[0] + "_VERSION");
    vv.push_back(args[0] + "_VERSION_MAJOR");
    vv.push_back(args[0] + "_VERSION_MINOR");
    vv.push_back(args[0] + "_VERSION_PATCH");
    vv.push_back(args[0] + "_VERSION_TWEAK");
    std::string vw;
    for(std::vector<std::string>::iterator i = vv.begin();
        i != vv.end(); ++i)
      {
      const char* v = this->Makefile->GetDefinition(*i);
      if(v && *v)
        {
        if(cmp0048 == cmPolicies::WARN)
          {
          vw += "\n  ";
          vw += *i;
          }
        else
          {
          this->Makefile->AddDefinition(*i, "");
          }
        }
      }
    if(!vw.empty())
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      }
    }

  if (languages.empty())
    {
    // if no language is specified do c and c++
    languages.push_back("C");
    languages.push_back("CXX");
    }
  this->Makefile->EnableLanguage(languages, false);
  std::string extraInclude = "CMAKE_PROJECT_" + args[0] + "_INCLUDE";
  const char* include = this->Makefile->GetDefinition(extraInclude);
  if(include)
    {
    bool readit =
      this->Makefile->ReadDependentFile(include);
    if(!readit && !cmSystemTools::GetFatalErrorOccured())
      {
      std::string m =
        "could not find file:\n"
        "  ";
      m += include;
      this->SetError(m);
      return false;
      }
    }
  return true;
}